

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gnutar_filename_encoding.c
# Opt level: O3

void test_gnutar_filename_encoding_CP932_UTF8(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *a;
  archive_entry *entry;
  size_t used;
  char buff [4096];
  size_t local_1040;
  undefined1 local_1038 [4104];
  
  pcVar2 = setlocale(6,"Japanese_Japan");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = setlocale(6,"ja_JP.SJIS");
    if (pcVar2 == (char *)0x0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                     ,L'Ũ');
      test_skipping("CP932/SJIS locale not available on this system.");
      return;
    }
  }
  a = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_gnutar((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'Ű',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_gnutar(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options((archive *)a,"hdrcharset=UTF-8");
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                   ,L'Ų');
    test_skipping("This system cannot convert character-set from CP932/SJIS to UTF-8.");
    archive_write_free((archive *)a);
    return;
  }
  iVar1 = archive_write_open_memory((archive *)a,local_1038,0x1000,&local_1040);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'Ÿ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
  entry = archive_entry_new2(a);
  archive_entry_set_pathname(entry,anon_var_dwarf_cd1c2 + 0xb);
  archive_entry_set_filetype(entry,0x8000);
  archive_entry_set_size(entry,0);
  iVar1 = archive_write_header((archive *)a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'ƀ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",(void *)0x0
                     );
  archive_entry_free(entry);
  iVar1 = archive_write_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'Ƃ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                      ,L'ƅ',local_1038,"buff",anon_var_dwarf_6a8e9 + 0x10,"\"\\xE8\\xA1\\xA8.txt\""
                      ,7,"7",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_gnutar_filename_encoding_CP932_UTF8)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "Japanese_Japan") &&
	    NULL == setlocale(LC_ALL, "ja_JP.SJIS")) {
		skipping("CP932/SJIS locale not available on this system.");
		return;
	}

	/*
	 * Verify that CP932/SJIS filenames are correctly translated to UTF-8.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_gnutar(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from CP932/SJIS to UTF-8.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set an CP932/SJIS filename. */
	archive_entry_set_pathname(entry, "\x95\x5C.txt");
	/* Check the Unicode version. */
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Check UTF-8 version. */
	assertEqualMem(buff, "\xE8\xA1\xA8.txt", 7);
}